

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O0

int Gia_ManRebuildNode(Dsd_Manager_t *pManDsd,Dsd_Node_t *pNodeDsd,Gia_Man_t *pNew,DdManager *ddNew,
                      Vec_Int_t *vFanins,Vec_Str_t *vSop,Vec_Str_t *vCube)

{
  Dsd_Type_t DVar1;
  int iVar2;
  int iVar3;
  DdManager *dd;
  Dsd_Node_t *pDVar4;
  DdNode *n;
  DdNode *n_00;
  int local_68;
  int iLit;
  int nDecs;
  int i;
  Dsd_Type_t Type;
  Dsd_Node_t *pFaninDsd;
  DdNode *bTemp;
  DdNode *bLocal;
  DdManager *ddDsd;
  Vec_Str_t *vSop_local;
  Vec_Int_t *vFanins_local;
  DdManager *ddNew_local;
  Gia_Man_t *pNew_local;
  Dsd_Node_t *pNodeDsd_local;
  Dsd_Manager_t *pManDsd_local;
  
  dd = Dsd_ManagerReadDd(pManDsd);
  DVar1 = Dsd_NodeReadType(pNodeDsd);
  iVar2 = Dsd_NodeReadDecsNum(pNodeDsd);
  if (iVar2 < 2) {
    __assert_fail("nDecs > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaClp.c"
                  ,0x9f,
                  "int Gia_ManRebuildNode(Dsd_Manager_t *, Dsd_Node_t *, Gia_Man_t *, DdManager *, Vec_Int_t *, Vec_Str_t *, Vec_Str_t *)"
                 );
  }
  Vec_IntClear(vFanins);
  iLit = 0;
  while( true ) {
    if (iVar2 <= iLit) {
      switch(DVar1) {
      case DSD_NODE_CONST1:
        local_68 = 1;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaClp.c"
                      ,0xcc,
                      "int Gia_ManRebuildNode(Dsd_Manager_t *, Dsd_Node_t *, Gia_Man_t *, DdManager *, Vec_Int_t *, Vec_Str_t *, Vec_Str_t *)"
                     );
      case DSD_NODE_OR:
        local_68 = 0;
        for (iLit = 0; iLit < iVar2; iLit = iLit + 1) {
          iVar3 = Vec_IntEntry(vFanins,iLit);
          local_68 = Gia_ManHashOr(pNew,local_68,iVar3);
        }
        break;
      case DSD_NODE_EXOR:
        local_68 = 0;
        for (iLit = 0; iLit < iVar2; iLit = iLit + 1) {
          iVar3 = Vec_IntEntry(vFanins,iLit);
          local_68 = Gia_ManHashXor(pNew,local_68,iVar3);
        }
        break;
      case DSD_NODE_PRIME:
        n = Dsd_TreeGetPrimeFunction(dd,pNodeDsd);
        Cudd_Ref(n);
        n_00 = Extra_TransferLevelByLevel(dd,ddNew,n);
        Cudd_Ref(n_00);
        Cudd_RecursiveDeref(dd,n);
        local_68 = Gia_ManRebuildIsop(ddNew,n_00,pNew,vFanins,vSop,vCube);
        Cudd_RecursiveDeref(ddNew,n_00);
      }
      Dsd_NodeSetMark(pNodeDsd,local_68);
      return local_68;
    }
    pDVar4 = Dsd_NodeReadDec(pNodeDsd,iLit);
    iVar3 = Dsd_NodeReadMark((Dsd_Node_t *)((ulong)pDVar4 & 0xfffffffffffffffe));
    iVar3 = Abc_LitNotCond(iVar3,(uint)pDVar4 & 1);
    if ((DVar1 != DSD_NODE_OR) && (((ulong)pDVar4 & 1) != 0)) break;
    Vec_IntPush(vFanins,iVar3);
    iLit = iLit + 1;
  }
  __assert_fail("Type == DSD_NODE_OR || !Dsd_IsComplement(pFaninDsd)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaClp.c"
                ,0xa6,
                "int Gia_ManRebuildNode(Dsd_Manager_t *, Dsd_Node_t *, Gia_Man_t *, DdManager *, Vec_Int_t *, Vec_Str_t *, Vec_Str_t *)"
               );
}

Assistant:

int Gia_ManRebuildNode( Dsd_Manager_t * pManDsd, Dsd_Node_t * pNodeDsd, Gia_Man_t * pNew, DdManager * ddNew, Vec_Int_t * vFanins, Vec_Str_t * vSop, Vec_Str_t * vCube )
{
    DdManager * ddDsd = Dsd_ManagerReadDd( pManDsd );
    DdNode * bLocal, * bTemp;
    Dsd_Node_t * pFaninDsd;
    Dsd_Type_t Type;
    int i, nDecs, iLit = -1;

    // add the fanins
    Type  = Dsd_NodeReadType( pNodeDsd );
    nDecs = Dsd_NodeReadDecsNum( pNodeDsd );
    assert( nDecs > 1 );
    Vec_IntClear( vFanins );
    for ( i = 0; i < nDecs; i++ )
    {
        pFaninDsd = Dsd_NodeReadDec( pNodeDsd, i );
        iLit      = Dsd_NodeReadMark( Dsd_Regular(pFaninDsd) );
        iLit      = Abc_LitNotCond( iLit, Dsd_IsComplement(pFaninDsd) );
        assert( Type == DSD_NODE_OR || !Dsd_IsComplement(pFaninDsd) );
        Vec_IntPush( vFanins, iLit );
    }

    // create the local function depending on the type of the node
    switch ( Type )
    {
        case DSD_NODE_CONST1:
        {
            iLit = 1;
            break;
        }
        case DSD_NODE_OR:
        {
            iLit = 0;
            for ( i = 0; i < nDecs; i++ )
                iLit = Gia_ManHashOr( pNew, iLit, Vec_IntEntry(vFanins, i) );
            break;
        }
        case DSD_NODE_EXOR:
        {
            iLit = 0;
            for ( i = 0; i < nDecs; i++ )
                iLit = Gia_ManHashXor( pNew, iLit, Vec_IntEntry(vFanins, i) );
            break;
        }
        case DSD_NODE_PRIME:
        {
            bLocal = Dsd_TreeGetPrimeFunction( ddDsd, pNodeDsd );                Cudd_Ref( bLocal );
            bLocal = Extra_TransferLevelByLevel( ddDsd, ddNew, bTemp = bLocal ); Cudd_Ref( bLocal );
            Cudd_RecursiveDeref( ddDsd, bTemp );
            // bLocal is now in the new BDD manager
            iLit = Gia_ManRebuildIsop( ddNew, bLocal, pNew, vFanins, vSop, vCube );
            Cudd_RecursiveDeref( ddNew, bLocal );
            break;
        }
        default:
        {
            assert( 0 );
            break;
        }
    }
    Dsd_NodeSetMark( pNodeDsd, iLit );
    return iLit;
}